

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNrStates::operator()
          (SetNrStates *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  E *this_00;
  size_t nrS;
  
  pPVar1 = this->_m_po;
  if (this->_m_haveTarget == true) {
    nrS = this->_m_target;
  }
  else {
    if (pPVar1->_m_lp_type != UINT) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"SetNrStates: no target value set and last parsed data type != UINT...");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    nrS = (size_t)pPVar1->_m_lp_uint;
  }
  MADPComponentDiscreteStates::SetNrStates
            (&(pPVar1->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete)._m_S,nrS);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_haveTarget)
                    _m_po->GetDecPOMDPDiscrete()->SetNrStates(_m_target);
                else if(_m_po->_m_lp_type == UINT)// || _m_lp_type
                    _m_po->GetDecPOMDPDiscrete()->SetNrStates(_m_po->_m_lp_uint);
                else
                    throw E("SetNrStates: no target value set and last parsed data type != UINT...");
            }